

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queryFunctions.cpp
# Opt level: O2

bool __thiscall
helics::waitForFed(helics *this,Federate *fed,string_view fedName,milliseconds timeout)

{
  bool bVar1;
  long lVar2;
  string_view target;
  string_view target_00;
  string_view queryStr;
  string_view queryStr_00;
  milliseconds delta;
  string res;
  string local_50;
  
  target._M_str = (char *)fedName._M_len;
  target._M_len = (size_t)fed;
  queryStr._M_str = "exists";
  queryStr._M_len = 6;
  Federate::query_abi_cxx11_(&res,(Federate *)this,target,queryStr,HELICS_SEQUENCING_MODE_FAST);
  delta.__r = 400;
  lVar2 = 0;
  do {
    bVar1 = std::operator==(&res,"true");
    if (bVar1) break;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&delta);
    target_00._M_str = (char *)fedName._M_len;
    target_00._M_len = (size_t)fed;
    queryStr_00._M_str = "exists";
    queryStr_00._M_len = 6;
    Federate::query_abi_cxx11_
              (&local_50,(Federate *)this,target_00,queryStr_00,HELICS_SEQUENCING_MODE_FAST);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&res,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    lVar2 = lVar2 + delta.__r;
  } while (lVar2 < (long)fedName._M_str);
  std::__cxx11::string::~string((string *)&res);
  return bVar1;
}

Assistant:

bool waitForFed(helics::Federate* fed, std::string_view fedName, std::chrono::milliseconds timeout)
{
    auto res = fed->query(fedName, "exists");
    std::chrono::milliseconds waitTime{0};
    const std::chrono::milliseconds delta{400};
    while (res != "true") {
        std::this_thread::sleep_for(delta);
        res = fed->query(fedName, "exists");
        waitTime += delta;
        if (waitTime >= timeout) {
            return false;
        }
    }
    return true;
}